

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * chaiscript::exception::eval_error::format_parameters_abi_cxx11_
                   (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                    *t_parameters,bool t_dot_notation,Dispatch_Engine *t_ss)

{
  bool bVar1;
  size_type sVar2;
  Dispatch_Engine *in_RCX;
  byte in_DL;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *in_RSI;
  char *pcVar3;
  string *in_RDI;
  const_iterator itr;
  string paramstr;
  stringstream ss;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffd98;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  *in_stack_fffffffffffffda0;
  ostream *poVar4;
  undefined7 in_stack_fffffffffffffdb0;
  byte in_stack_fffffffffffffdb7;
  Dispatch_Engine *this;
  string local_230 [32];
  Boxed_Value *local_210;
  string local_208 [32];
  Boxed_Value *local_1e8;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_1e0;
  string local_1d8 [48];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  Dispatch_Engine *local_20;
  byte local_11;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *local_10;
  
  local_11 = in_DL & 1;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"(");
  bVar1 = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::empty
                    ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                     CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  if (!bVar1) {
    std::__cxx11::string::string(local_1d8);
    local_1e0._M_current =
         (Boxed_Value *)
         std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::begin
                   (in_stack_fffffffffffffd98);
    while( true ) {
      local_1e8 = (Boxed_Value *)
                  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
                  end(in_stack_fffffffffffffd98);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffda0,
                         (__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                          *)in_stack_fffffffffffffd98);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
      ::operator->(&local_1e0);
      bVar1 = Boxed_Value::is_const((Boxed_Value *)0x21a479);
      pcVar3 = "";
      if (bVar1) {
        pcVar3 = "const ";
      }
      std::__cxx11::string::operator+=(local_1d8,pcVar3);
      this = local_20;
      __gnu_cxx::
      __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
      ::operator*(&local_1e0);
      chaiscript::detail::Dispatch_Engine::type_name_abi_cxx11_
                (this,(Boxed_Value *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
      std::__cxx11::string::operator+=(local_1d8,local_208);
      std::__cxx11::string::~string(local_208);
      local_210 = (Boxed_Value *)
                  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
                  begin(in_stack_fffffffffffffd98);
      bVar1 = __gnu_cxx::operator==
                        (in_stack_fffffffffffffda0,
                         (__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                          *)in_stack_fffffffffffffd98);
      in_stack_fffffffffffffdb7 = local_11;
      if (!bVar1) {
        in_stack_fffffffffffffdb7 = 0;
      }
      if ((in_stack_fffffffffffffdb7 & 1) == 0) {
        std::__cxx11::string::operator+=(local_1d8,", ");
      }
      else {
        std::__cxx11::string::operator+=(local_1d8,").(");
        sVar2 = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::size
                          (local_10);
        if (sVar2 == 1) {
          std::__cxx11::string::operator+=(local_1d8,", ");
        }
      }
      __gnu_cxx::
      __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
      ::operator++(&local_1e0);
    }
    poVar4 = local_198;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_230,(ulong)local_1d8);
    std::operator<<(poVar4,local_230);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::string::~string(local_1d8);
  }
  std::operator<<(local_198,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return in_RDI;
}

Assistant:

static std::string format_parameters(const std::vector<Boxed_Value> &t_parameters,
          bool t_dot_notation,
          const chaiscript::detail::Dispatch_Engine &t_ss)
      {
        std::stringstream ss;
        ss << "(";

        if (!t_parameters.empty())
        {
          std::string paramstr;

          for (auto itr = t_parameters.begin();
               itr != t_parameters.end();
               ++itr)
          {
            paramstr += (itr->is_const()?"const ":"");
            paramstr += t_ss.type_name(*itr);

            if (itr == t_parameters.begin() && t_dot_notation)
            {
              paramstr += ").(";
              if (t_parameters.size() == 1)
              {
                paramstr += ", ";
              }
            } else {
              paramstr += ", ";
            }
          }

          ss << paramstr.substr(0, paramstr.size() - 2);
        }
        ss << ")";

        return ss.str();
      }